

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binned_histogram.cpp
# Opt level: O0

void duckdb::IsHistogramOtherBinFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  bool bVar1;
  reference pvVar2;
  Vector *this;
  Value *in_RDX;
  DataChunk *in_RDI;
  Vector ref;
  Value v;
  LogicalType *input_type;
  LogicalType *in_stack_fffffffffffffeb8;
  vector<duckdb::Vector,_true> *in_stack_fffffffffffffec0;
  Vector local_118 [104];
  Value local_b0 [80];
  Value local_60 [64];
  LogicalType *local_20;
  Value *local_18;
  DataChunk *local_8;
  
  local_18 = in_RDX;
  local_8 = in_RDI;
  pvVar2 = vector<duckdb::Vector,_true>::operator[]
                     (in_stack_fffffffffffffec0,(size_type)in_stack_fffffffffffffeb8);
  local_20 = Vector::GetType(pvVar2);
  bVar1 = SupportsOtherBucket(in_stack_fffffffffffffeb8);
  if (bVar1) {
    OtherBucketValue(_v);
    duckdb::Vector::Vector(local_118,local_b0);
    pvVar2 = vector<duckdb::Vector,_true>::operator[]
                       (in_stack_fffffffffffffec0,(size_type)in_stack_fffffffffffffeb8);
    this = (Vector *)DataChunk::size(local_8);
    duckdb::VectorOperations::NotDistinctFrom(pvVar2,local_118,(Vector *)local_18,(ulong)this);
    Vector::~Vector(this);
    duckdb::Value::~Value(local_b0);
  }
  else {
    duckdb::Value::BOOLEAN(SUB81(local_60,0));
    duckdb::Vector::Reference(local_18);
    duckdb::Value::~Value(local_60);
  }
  return;
}

Assistant:

static void IsHistogramOtherBinFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	auto &input_type = args.data[0].GetType();
	if (!SupportsOtherBucket(input_type)) {
		result.Reference(Value::BOOLEAN(false));
		return;
	}
	auto v = OtherBucketValue(input_type);
	Vector ref(v);
	VectorOperations::NotDistinctFrom(args.data[0], ref, result, args.size());
}